

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsInputOutput.cpp
# Opt level: O1

void chrono::utils::ReadCheckpoint(ChSystem *system,string *filename)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  char *pcVar3;
  ChBody *pCVar4;
  char cVar5;
  uint uVar6;
  int iVar7;
  istream *piVar8;
  void *pvVar9;
  undefined4 extraout_var;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  shared_ptr<chrono::ChMaterialSurfaceSMC> matSMC;
  shared_ptr<chrono::ChBody> body;
  double height;
  shared_ptr<chrono::ChMaterialSurface> mat;
  int ctype;
  short family_mask;
  short family_group;
  int n_shapes;
  ChVector<double> spos;
  double dummy;
  int stype;
  int bcollide;
  int bfixed;
  int bid;
  ChQuaternion<double> srot;
  ChVector<double> bpos;
  string line;
  ChVector<double> bpos_dt;
  ChVector<double> inertiaXX;
  double mass;
  ChQuaternion<double> brot_dt;
  ChQuaternion<double> brot;
  double dummy_1;
  ifstream ifile;
  istringstream iss0;
  istringstream iss3;
  istringstream iss1;
  istringstream iss;
  ChVector<double> local_ae8;
  ChBody *local_ac8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_ac0;
  element_type *local_ab8;
  element_type *local_ab0;
  element_type *local_aa8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_aa0 [2];
  element_type *local_a90;
  int local_a84;
  short local_a80;
  short local_a7e;
  int local_a7c;
  ChVector<double> local_a78;
  double local_a60;
  int local_a58;
  int local_a54;
  int local_a50;
  int local_a4c;
  ChQuaternion<double> local_a48;
  double local_a28;
  double dStack_a20;
  double local_a18;
  shared_ptr<chrono::ChMaterialSurface> local_a08;
  shared_ptr<chrono::ChMaterialSurface> local_9f8;
  shared_ptr<chrono::ChMaterialSurface> local_9e8;
  shared_ptr<chrono::ChMaterialSurface> local_9d8;
  shared_ptr<chrono::ChMaterialSurface> local_9c8;
  shared_ptr<chrono::ChMaterialSurface> local_9b8;
  shared_ptr<chrono::ChMaterialSurface> local_9a8;
  shared_ptr<chrono::ChMaterialSurface> local_998;
  ChBody *local_988;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_980;
  undefined1 *local_978;
  undefined8 local_970;
  undefined1 local_968;
  undefined7 uStack_967;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  ChVector<double> local_938;
  ChSystem *local_920;
  double local_918;
  double local_910;
  double local_908 [4];
  ChQuaternion<double> local_8e8;
  shared_ptr<chrono::ChVisualMaterial> local_8c0;
  shared_ptr<chrono::ChVisualMaterial> local_8b0;
  shared_ptr<chrono::ChVisualMaterial> local_8a0;
  shared_ptr<chrono::ChVisualMaterial> local_890;
  shared_ptr<chrono::ChVisualMaterial> local_880;
  shared_ptr<chrono::ChVisualMaterial> local_870;
  shared_ptr<chrono::ChVisualMaterial> local_860;
  shared_ptr<chrono::ChVisualMaterial> local_850;
  long local_838 [65];
  istringstream local_630 [120];
  ios_base local_5b8 [264];
  istringstream local_4b0 [120];
  ios_base local_438 [264];
  istringstream local_330 [120];
  ios_base local_2b8 [264];
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  std::ifstream::ifstream(local_838,(filename->_M_dataplus)._M_p,_S_in);
  local_978 = &local_968;
  local_970 = 0;
  local_968 = 0;
  cVar5 = std::ios::widen((char)local_838 + (char)*(undefined8 *)(local_838[0] + -0x18));
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_838,(string *)&local_978,cVar5);
  std::__cxx11::istringstream::istringstream(local_630,(string *)&local_978,_S_in);
  std::istream::operator>>(local_630,&local_a84);
  iVar7 = local_a84;
  uVar6 = (*(system->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x2f])(system)
  ;
  if (uVar6 == (iVar7 != 0)) {
    local_920 = system;
    while( true ) {
      cVar5 = std::ios::widen((char)*(undefined8 *)(local_838[0] + -0x18) +
                              (char)(istream *)local_838);
      piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_838,(string *)&local_978,cVar5);
      if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) != 0) break;
      std::__cxx11::istringstream::istringstream(local_330,(string *)&local_978,_S_in);
      pvVar9 = (void *)std::istream::operator>>(local_330,&local_a4c);
      pvVar9 = (void *)std::istream::operator>>(pvVar9,&local_a50);
      pvVar9 = (void *)std::istream::operator>>(pvVar9,&local_a54);
      pvVar9 = (void *)std::istream::operator>>(pvVar9,&local_a7e);
      std::istream::operator>>(pvVar9,&local_a80);
      local_938.m_data[0] = 0.0;
      local_938.m_data[1] = 0.0;
      local_938.m_data[2] = 0.0;
      piVar8 = std::istream::_M_extract<double>((double *)local_330);
      piVar8 = std::istream::_M_extract<double>((double *)piVar8);
      piVar8 = std::istream::_M_extract<double>((double *)piVar8);
      std::istream::_M_extract<double>((double *)piVar8);
      local_a28 = 0.0;
      dStack_a20 = 0.0;
      local_a18 = 0.0;
      local_948 = 0;
      local_958 = 0;
      uStack_950 = 0;
      local_908 = (double  [4])(ZEXT432(0) << 0x40);
      local_8e8.m_data = local_908;
      piVar8 = std::istream::_M_extract<double>((double *)local_330);
      piVar8 = std::istream::_M_extract<double>((double *)piVar8);
      std::istream::_M_extract<double>((double *)piVar8);
      piVar8 = std::istream::_M_extract<double>((double *)local_330);
      piVar8 = std::istream::_M_extract<double>((double *)piVar8);
      piVar8 = std::istream::_M_extract<double>((double *)piVar8);
      std::istream::_M_extract<double>((double *)piVar8);
      piVar8 = std::istream::_M_extract<double>((double *)local_330);
      piVar8 = std::istream::_M_extract<double>((double *)piVar8);
      std::istream::_M_extract<double>((double *)piVar8);
      piVar8 = std::istream::_M_extract<double>((double *)local_330);
      piVar8 = std::istream::_M_extract<double>((double *)piVar8);
      piVar8 = std::istream::_M_extract<double>((double *)piVar8);
      std::istream::_M_extract<double>((double *)piVar8);
      iVar7 = (*(system->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x30])
                        (system);
      local_ac8 = (ChBody *)CONCAT44(extraout_var,iVar7);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChBody*>
                (&local_ac0,local_ac8);
      local_988 = local_ac8;
      local_980 = local_ac0._M_pi;
      if (local_ac0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_ac0._M_pi)->_M_use_count = (local_ac0._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_ac0._M_pi)->_M_use_count = (local_ac0._M_pi)->_M_use_count + 1;
        }
      }
      (*(system->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x25])
                (system,&local_988);
      if (local_980 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_980);
      }
      if (&(local_ac8->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord !=
          (ChCoordsys<double> *)&local_a28) {
        (local_ac8->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.pos.
        m_data[0] = local_a28;
        (local_ac8->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.pos.
        m_data[1] = dStack_a20;
        (local_ac8->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.pos.
        m_data[2] = local_a18;
      }
      ChFrame<double>::SetRot((ChFrame<double> *)&local_ac8->super_ChBodyFrame,&local_8e8);
      (*(local_ac8->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
        _vptr_ChFrame[7])(&local_ac8->super_ChBodyFrame,&local_958);
      (*(local_ac8->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
        _vptr_ChFrame[8])(&local_ac8->super_ChBodyFrame,local_908);
      (local_ac8->super_ChPhysicsItem).super_ChObj.m_identifier = local_a4c;
      ChBody::SetBodyFixed(local_ac8,local_a50 != 0);
      ChBody::SetCollide(local_ac8,local_a54 != 0);
      ChVariablesBodyOwnMass::SetBodyMass(&local_ac8->variables,local_910);
      ChBody::SetInertiaXX(local_ac8,&local_938);
      cVar5 = std::ios::widen((char)*(undefined8 *)(local_838[0] + -0x18) + (char)local_838);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_838,(string *)&local_978,cVar5);
      std::__cxx11::istringstream::istringstream(local_4b0,(string *)&local_978,_S_in);
      std::istream::operator>>(local_4b0,&local_a7c);
      peVar1 = (local_ac8->collision_model).
               super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      p_Var2 = (local_ac8->collision_model).
               super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
      }
      (*peVar1->_vptr_ChCollisionModel[3])();
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      if (0 < local_a7c) {
        iVar7 = 0;
        do {
          cVar5 = std::ios::widen((char)*(undefined8 *)(local_838[0] + -0x18) +
                                  (char)(istream *)local_838);
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)local_838,(string *)&local_978,cVar5);
          std::__cxx11::istringstream::istringstream(local_1b0,(string *)&local_978,_S_in);
          local_a78.m_data[0] = 0.0;
          local_a78.m_data[1] = 0.0;
          local_a78.m_data[2] = 0.0;
          local_a48.m_data = (double  [4])(ZEXT432(0) << 0x40);
          piVar8 = std::istream::_M_extract<double>((double *)local_1b0);
          piVar8 = std::istream::_M_extract<double>((double *)piVar8);
          piVar8 = std::istream::_M_extract<double>((double *)piVar8);
          piVar8 = std::istream::_M_extract<double>((double *)piVar8);
          piVar8 = std::istream::_M_extract<double>((double *)piVar8);
          piVar8 = std::istream::_M_extract<double>((double *)piVar8);
          std::istream::_M_extract<double>((double *)piVar8);
          local_aa8 = (element_type *)0x0;
          a_Stack_aa0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (local_a84 == 0) {
            local_ae8.m_data[0] = 0.0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<chrono::ChMaterialSurfaceNSC,std::allocator<chrono::ChMaterialSurfaceNSC>>
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_ae8.m_data + 1),
                       (ChMaterialSurfaceNSC **)&local_ae8,
                       (allocator<chrono::ChMaterialSurfaceNSC> *)&local_ab0);
            piVar8 = std::istream::_M_extract<float>((float *)local_1b0);
            piVar8 = std::istream::_M_extract<float>((float *)piVar8);
            piVar8 = std::istream::_M_extract<float>((float *)piVar8);
            std::istream::_M_extract<float>((float *)piVar8);
            piVar8 = std::istream::_M_extract<float>((float *)local_1b0);
            piVar8 = std::istream::_M_extract<float>((float *)piVar8);
            std::istream::_M_extract<float>((float *)piVar8);
            piVar8 = std::istream::_M_extract<float>((float *)local_1b0);
            piVar8 = std::istream::_M_extract<float>((float *)piVar8);
            piVar8 = std::istream::_M_extract<float>((float *)piVar8);
            std::istream::_M_extract<float>((float *)piVar8);
          }
          else {
            local_ae8.m_data[0] = 0.0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<chrono::ChMaterialSurfaceSMC,std::allocator<chrono::ChMaterialSurfaceSMC>>
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_ae8.m_data + 1),
                       (ChMaterialSurfaceSMC **)&local_ae8,
                       (allocator<chrono::ChMaterialSurfaceSMC> *)&local_ab0);
            piVar8 = std::istream::_M_extract<float>((float *)local_1b0);
            std::istream::_M_extract<float>((float *)piVar8);
            piVar8 = std::istream::_M_extract<float>((float *)local_1b0);
            std::istream::_M_extract<float>((float *)piVar8);
            piVar8 = std::istream::_M_extract<float>((float *)local_1b0);
            piVar8 = std::istream::_M_extract<float>((float *)piVar8);
            std::istream::_M_extract<float>((float *)piVar8);
            piVar8 = std::istream::_M_extract<float>((float *)local_1b0);
            piVar8 = std::istream::_M_extract<float>((float *)piVar8);
            piVar8 = std::istream::_M_extract<float>((float *)piVar8);
            std::istream::_M_extract<float>((float *)piVar8);
          }
          local_aa8 = (element_type *)local_ae8.m_data[0];
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (a_Stack_aa0,
                     (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_ae8.m_data + 1));
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_ae8.m_data[1] !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_ae8.m_data[1]);
          }
          std::istream::operator>>(local_1b0,&local_a58);
          switch(local_a58) {
          case 0:
            std::istream::_M_extract<double>((double *)local_1b0);
            pCVar4 = local_ac8;
            local_998.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = local_aa8;
            local_998.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = a_Stack_aa0[0]._M_pi;
            if (a_Stack_aa0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (a_Stack_aa0[0]._M_pi)->_M_use_count = (a_Stack_aa0[0]._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (a_Stack_aa0[0]._M_pi)->_M_use_count = (a_Stack_aa0[0]._M_pi)->_M_use_count + 1;
              }
            }
            local_ab8 = (element_type *)local_ae8.m_data[0];
            ChVisualMaterial::Default();
            AddSphereGeometry(pCVar4,&local_998,(double)local_ab8,&local_a78,&local_a48,true,
                              &local_850);
            this._M_pi = local_998.
                         super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
            if (local_850.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_850.
                         super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
              this._M_pi = local_998.
                           super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
            }
            break;
          case 1:
            local_ae8.m_data[0] = 0.0;
            local_ae8.m_data[1] = 0.0;
            local_ae8.m_data[2] = 0.0;
            piVar8 = std::istream::_M_extract<double>((double *)local_1b0);
            piVar8 = std::istream::_M_extract<double>((double *)piVar8);
            std::istream::_M_extract<double>((double *)piVar8);
            pCVar4 = local_ac8;
            local_9a8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = local_aa8;
            local_9a8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = a_Stack_aa0[0]._M_pi;
            if (a_Stack_aa0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (a_Stack_aa0[0]._M_pi)->_M_use_count = (a_Stack_aa0[0]._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (a_Stack_aa0[0]._M_pi)->_M_use_count = (a_Stack_aa0[0]._M_pi)->_M_use_count + 1;
              }
            }
            ChVisualMaterial::Default();
            AddEllipsoidGeometry(pCVar4,&local_9a8,&local_ae8,&local_a78,&local_a48,true,&local_860)
            ;
            this._M_pi = local_9a8.
                         super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
            if (local_860.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_860.
                         super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
              this._M_pi = local_9a8.
                           super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
            }
            break;
          case 2:
            local_ae8.m_data[0] = 0.0;
            local_ae8.m_data[1] = 0.0;
            local_ae8.m_data[2] = 0.0;
            piVar8 = std::istream::_M_extract<double>((double *)local_1b0);
            piVar8 = std::istream::_M_extract<double>((double *)piVar8);
            std::istream::_M_extract<double>((double *)piVar8);
            pCVar4 = local_ac8;
            local_9b8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = local_aa8;
            local_9b8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = a_Stack_aa0[0]._M_pi;
            if (a_Stack_aa0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (a_Stack_aa0[0]._M_pi)->_M_use_count = (a_Stack_aa0[0]._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (a_Stack_aa0[0]._M_pi)->_M_use_count = (a_Stack_aa0[0]._M_pi)->_M_use_count + 1;
              }
            }
            ChVisualMaterial::Default();
            AddBoxGeometry(pCVar4,&local_9b8,&local_ae8,&local_a78,&local_a48,true,&local_870);
            this._M_pi = local_9b8.
                         super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
            if (local_870.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_870.
                         super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
              this._M_pi = local_9b8.
                           super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
            }
            break;
          case 3:
            piVar8 = std::istream::_M_extract<double>((double *)local_1b0);
            piVar8 = std::istream::_M_extract<double>((double *)piVar8);
            std::istream::_M_extract<double>((double *)piVar8);
            pCVar4 = local_ac8;
            local_9d8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = local_aa8;
            local_9d8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = a_Stack_aa0[0]._M_pi;
            if (a_Stack_aa0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (a_Stack_aa0[0]._M_pi)->_M_use_count = (a_Stack_aa0[0]._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (a_Stack_aa0[0]._M_pi)->_M_use_count = (a_Stack_aa0[0]._M_pi)->_M_use_count + 1;
              }
            }
            local_ab8 = (element_type *)local_ae8.m_data[0];
            local_a90 = local_ab0;
            ChVisualMaterial::Default();
            AddCylinderGeometry(pCVar4,&local_9d8,(double)local_ab8,(double)local_a90,&local_a78,
                                &local_a48,true,&local_890);
            this._M_pi = local_9d8.
                         super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
            if (local_890.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_890.
                         super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
              this._M_pi = local_9d8.
                           super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
            }
            break;
          default:
            goto switchD_00947c1b_caseD_4;
          case 10:
            piVar8 = std::istream::_M_extract<double>((double *)local_1b0);
            std::istream::_M_extract<double>((double *)piVar8);
            pCVar4 = local_ac8;
            local_9c8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = local_aa8;
            local_9c8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = a_Stack_aa0[0]._M_pi;
            if (a_Stack_aa0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (a_Stack_aa0[0]._M_pi)->_M_use_count = (a_Stack_aa0[0]._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (a_Stack_aa0[0]._M_pi)->_M_use_count = (a_Stack_aa0[0]._M_pi)->_M_use_count + 1;
              }
            }
            local_ab8 = (element_type *)local_ae8.m_data[0];
            local_a90 = local_ab0;
            ChVisualMaterial::Default();
            AddCapsuleGeometry(pCVar4,&local_9c8,(double)local_ab8,(double)local_a90,&local_a78,
                               &local_a48,true,&local_880);
            this._M_pi = local_9c8.
                         super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
            if (local_880.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_880.
                         super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
              this._M_pi = local_9c8.
                           super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
            }
            break;
          case 0xb:
            piVar8 = std::istream::_M_extract<double>((double *)local_1b0);
            piVar8 = std::istream::_M_extract<double>((double *)piVar8);
            std::istream::_M_extract<double>((double *)piVar8);
            pCVar4 = local_ac8;
            local_9e8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = local_aa8;
            local_9e8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = a_Stack_aa0[0]._M_pi;
            if (a_Stack_aa0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (a_Stack_aa0[0]._M_pi)->_M_use_count = (a_Stack_aa0[0]._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (a_Stack_aa0[0]._M_pi)->_M_use_count = (a_Stack_aa0[0]._M_pi)->_M_use_count + 1;
              }
            }
            local_ab8 = (element_type *)local_ae8.m_data[0];
            local_a90 = local_ab0;
            ChVisualMaterial::Default();
            AddConeGeometry(pCVar4,&local_9e8,(double)local_ab8,(double)local_a90,&local_a78,
                            &local_a48,true,&local_8a0);
            this._M_pi = local_9e8.
                         super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
            if (local_8a0.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_8a0.
                         super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
              this._M_pi = local_9e8.
                           super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
            }
            break;
          case 0xc:
            local_ae8.m_data[0] = 0.0;
            local_ae8.m_data[1] = 0.0;
            local_ae8.m_data[2] = 0.0;
            piVar8 = std::istream::_M_extract<double>((double *)local_1b0);
            piVar8 = std::istream::_M_extract<double>((double *)piVar8);
            piVar8 = std::istream::_M_extract<double>((double *)piVar8);
            std::istream::_M_extract<double>((double *)piVar8);
            pCVar4 = local_ac8;
            local_9f8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = local_aa8;
            local_9f8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = a_Stack_aa0[0]._M_pi;
            if (a_Stack_aa0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (a_Stack_aa0[0]._M_pi)->_M_use_count = (a_Stack_aa0[0]._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (a_Stack_aa0[0]._M_pi)->_M_use_count = (a_Stack_aa0[0]._M_pi)->_M_use_count + 1;
              }
            }
            local_ab8 = local_ab0;
            ChVisualMaterial::Default();
            AddRoundedBoxGeometry
                      (pCVar4,&local_9f8,&local_ae8,(double)local_ab8,&local_a78,&local_a48,true,
                       &local_8b0);
            this._M_pi = local_9f8.
                         super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
            if (local_8b0.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_8b0.
                         super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
              this._M_pi = local_9f8.
                           super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
            }
            break;
          case 0xd:
            piVar8 = std::istream::_M_extract<double>((double *)local_1b0);
            piVar8 = std::istream::_M_extract<double>((double *)piVar8);
            piVar8 = std::istream::_M_extract<double>((double *)piVar8);
            std::istream::_M_extract<double>((double *)piVar8);
            pCVar4 = local_ac8;
            local_a08.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = local_aa8;
            local_a08.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = a_Stack_aa0[0]._M_pi;
            if (a_Stack_aa0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (a_Stack_aa0[0]._M_pi)->_M_use_count = (a_Stack_aa0[0]._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (a_Stack_aa0[0]._M_pi)->_M_use_count = (a_Stack_aa0[0]._M_pi)->_M_use_count + 1;
              }
            }
            local_ab8 = (element_type *)local_ae8.m_data[0];
            local_a90 = local_ab0;
            local_918 = local_a60;
            ChVisualMaterial::Default();
            AddRoundedCylinderGeometry
                      (pCVar4,&local_a08,(double)local_ab8,(double)local_a90,local_918,&local_a78,
                       &local_a48,true,&local_8c0);
            this._M_pi = local_a08.
                         super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
            if (local_8c0.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_8c0.
                         super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
              this._M_pi = local_a08.
                           super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
            }
          }
          if (this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this._M_pi);
          }
switchD_00947c1b_caseD_4:
          if (a_Stack_aa0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_aa0[0]._M_pi);
          }
          std::__cxx11::istringstream::~istringstream(local_1b0);
          std::ios_base::~ios_base(local_138);
          iVar7 = iVar7 + 1;
        } while (iVar7 < local_a7c);
      }
      peVar1 = (local_ac8->collision_model).
               super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      p_Var2 = (local_ac8->collision_model).
               super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
      }
      (*peVar1->_vptr_ChCollisionModel[0x1f])(peVar1,(ulong)(uint)(int)local_a7e);
      system = local_920;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      peVar1 = (local_ac8->collision_model).
               super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      p_Var2 = (local_ac8->collision_model).
               super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
      }
      (*peVar1->_vptr_ChCollisionModel[0x21])(peVar1,(ulong)(uint)(int)local_a80);
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      peVar1 = (local_ac8->collision_model).
               super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      p_Var2 = (local_ac8->collision_model).
               super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
      }
      (*peVar1->_vptr_ChCollisionModel[4])();
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      std::__cxx11::istringstream::~istringstream(local_4b0);
      std::ios_base::~ios_base(local_438);
      if (local_ac0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_ac0._M_pi);
      }
      std::__cxx11::istringstream::~istringstream(local_330);
      std::ios_base::~ios_base(local_2b8);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "utils::ReadCheckpoint ERROR: checkpoint data file inconsistent with the Chrono system\n"
               ,0x56);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"    Contact method in data file: ",0x21);
    pcVar3 = "ChMaterialSurfaceSMC";
    if (local_a84 == 0) {
      pcVar3 = "ChMaterialSurfaceNSC";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3 + 0x11,3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  }
  std::__cxx11::istringstream::~istringstream(local_630);
  std::ios_base::~ios_base(local_5b8);
  if (local_978 != &local_968) {
    operator_delete(local_978,CONCAT71(uStack_967,local_968) + 1);
  }
  std::ifstream::~ifstream(local_838);
  return;
}

Assistant:

void ReadCheckpoint(ChSystem* system, const std::string& filename) {
    // Open input file stream
    std::ifstream ifile(filename.c_str());
    std::string line;

    // Read the contact method type
    std::getline(ifile, line);
    std::istringstream iss0(line);
    int ctype;
    iss0 >> ctype;
    auto contact_method = (ctype == 0) ? ChContactMethod::NSC : ChContactMethod::SMC;

    // Check consistency with the current system
    if (contact_method != system->GetContactMethod()) {
        std::cout << "utils::ReadCheckpoint ERROR: checkpoint data file inconsistent with the Chrono system\n";
        std::cout << "    Contact method in data file: " << (ctype == 0 ? "NSC" : "SMC") << "\n";
        return;
    }

    while (std::getline(ifile, line)) {
        std::istringstream iss1(line);

        // Read body Id and flags
        int bid, bfixed, bcollide;
        short family_group, family_mask;
        iss1 >> bid >> bfixed >> bcollide >> family_group >> family_mask;

        // Read body mass and inertia
        double mass;
        ChVector<> inertiaXX;
        iss1 >> mass >> inertiaXX.x() >> inertiaXX.y() >> inertiaXX.z();

        // Read body position, orientation, and their time derivatives
        ChVector<> bpos, bpos_dt;
        ChQuaternion<> brot, brot_dt;
        iss1 >> bpos.x() >> bpos.y() >> bpos.z();
        iss1 >> brot.e0() >> brot.e1() >> brot.e2() >> brot.e3();
        iss1 >> bpos_dt.x() >> bpos_dt.y() >> bpos_dt.z();
        iss1 >> brot_dt.e0() >> brot_dt.e1() >> brot_dt.e2() >> brot_dt.e3();

        // Create a body of the appropriate type
        auto body = std::shared_ptr<ChBody>(system->NewBody());
        system->AddBody(body);

        // Set body properties and state
        body->SetPos(bpos);
        body->SetRot(brot);
        body->SetPos_dt(bpos_dt);
        body->SetRot_dt(brot_dt);

        body->SetIdentifier(bid);
        body->SetBodyFixed(bfixed != 0);
        body->SetCollide(bcollide != 0);

        body->SetMass(mass);
        body->SetInertiaXX(inertiaXX);

        // Get next line in the file (number of collision shapes)
        std::getline(ifile, line);
        std::istringstream iss3(line);

        int n_shapes;
        iss3 >> n_shapes;

        // In a loop, read information about each shape and add geometry to the body
        body->GetCollisionModel()->ClearModel();

        for (int j = 0; j < n_shapes; j++) {
            std::getline(ifile, line);
            std::istringstream iss(line);

            // Get shape relative position and rotation
            ChVector<> spos;
            ChQuaternion<> srot;
            iss >> spos.x() >> spos.y() >> spos.z() >> srot.e0() >> srot.e1() >> srot.e2() >> srot.e3();

            // Get material information and create the material
            std::shared_ptr<ChMaterialSurface> mat;
            if (ctype == 0) {
                auto matNSC = chrono_types::make_shared<ChMaterialSurfaceNSC>();
                iss >> matNSC->static_friction >> matNSC->sliding_friction >> matNSC->rolling_friction >>
                    matNSC->spinning_friction;
                iss >> matNSC->restitution >> matNSC->cohesion >> matNSC->dampingf;
                iss >> matNSC->compliance >> matNSC->complianceT >> matNSC->complianceRoll >> matNSC->complianceSpin;
                mat = matNSC;
            } else {
                auto matSMC = chrono_types::make_shared<ChMaterialSurfaceSMC>();
                iss >> matSMC->young_modulus >> matSMC->poisson_ratio;
                iss >> matSMC->static_friction >> matSMC->sliding_friction;
                iss >> matSMC->restitution >> matSMC->constant_adhesion >> matSMC->adhesionMultDMT;
                iss >> matSMC->kn >> matSMC->gn >> matSMC->kt >> matSMC->gt;
                mat = matSMC;
            }

            // Get shape type and geometry data and create the shape (both visualization and contact).
            int stype;
            iss >> stype;

            switch (collision::ChCollisionShape::Type(stype)) {
                case collision::ChCollisionShape::Type::SPHERE: {
                    double radius;
                    iss >> radius;
                    AddSphereGeometry(body.get(), mat, radius, spos, srot);
                } break;
                case collision::ChCollisionShape::Type::ELLIPSOID: {
                    ChVector<> size;
                    iss >> size.x() >> size.y() >> size.z();
                    AddEllipsoidGeometry(body.get(), mat, size, spos, srot);
                } break;
                case collision::ChCollisionShape::Type::BOX: {
                    ChVector<> size;
                    iss >> size.x() >> size.y() >> size.z();
                    AddBoxGeometry(body.get(), mat, size, spos, srot);
                } break;
                case collision::ChCollisionShape::Type::CAPSULE: {
                    double radius, hlen;
                    iss >> radius >> hlen;
                    AddCapsuleGeometry(body.get(), mat, radius, hlen, spos, srot);
                } break;
                case collision::ChCollisionShape::Type::CYLINDER: {
                    double radius, hlen, dummy;
                    iss >> radius >> dummy >> hlen;
                    AddCylinderGeometry(body.get(), mat, radius, hlen, spos, srot);
                } break;
                case collision::ChCollisionShape::Type::CONE: {
                    double radius, height, dummy;
                    iss >> radius >> dummy >> height;
                    AddConeGeometry(body.get(), mat, radius, height, spos, srot);
                } break;
                case collision::ChCollisionShape::Type::ROUNDEDBOX: {
                    ChVector<> size;
                    double srad;
                    iss >> size.x() >> size.y() >> size.z() >> srad;
                    AddRoundedBoxGeometry(body.get(), mat, size, srad, spos, srot);
                } break;
                case collision::ChCollisionShape::Type::ROUNDEDCYL: {
                    double radius, hlen, srad, dummy;
                    iss >> radius >> dummy >> hlen >> srad;
                    AddRoundedCylinderGeometry(body.get(), mat, radius, hlen, srad, spos, srot);
                } break;
                default:
                    break;
            }
        }

        // Set the collision family group and the collision family mask.
        body->GetCollisionModel()->SetFamilyGroup(family_group);
        body->GetCollisionModel()->SetFamilyMask(family_mask);

        // Complete construction of the collision model.
        body->GetCollisionModel()->BuildModel();
    }
}